

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O2

void Fra_ClassNodesUnmark(Fra_Lcr_t *p)

{
  int *piVar1;
  Aig_Obj_t *pAVar2;
  Fra_Cla_t *pFVar3;
  undefined8 *puVar4;
  int iVar5;
  int iVar6;
  
  pFVar3 = p->pCla;
  iVar6 = pFVar3->pAig->nObjs[3] - pFVar3->pAig->nObjs[2];
  for (iVar5 = 0; iVar5 < pFVar3->vClasses1->nSize; iVar5 = iVar5 + 1) {
    piVar1 = (int *)Vec_PtrEntry(pFVar3->vClasses1,iVar5);
    pAVar2 = Aig_ManCo(p->pCla->pAig,*piVar1 + iVar6);
    pAVar2->field_0x18 = pAVar2->field_0x18 & 0xef;
    pFVar3 = p->pCla;
  }
  for (iVar5 = 0; iVar5 < pFVar3->vClasses->nSize; iVar5 = iVar5 + 1) {
    for (puVar4 = (undefined8 *)Vec_PtrEntry(pFVar3->vClasses,iVar5); (int *)*puVar4 != (int *)0x0;
        puVar4 = puVar4 + 1) {
      pAVar2 = Aig_ManCo(p->pCla->pAig,*(int *)*puVar4 + iVar6);
      pAVar2->field_0x18 = pAVar2->field_0x18 & 0xef;
    }
    pFVar3 = p->pCla;
  }
  return;
}

Assistant:

void Fra_ClassNodesUnmark( Fra_Lcr_t * p )
{
    Aig_Obj_t * pObj, ** ppClass;
    int i, c, Offset;
    // compute the LO/LI offset
    Offset = Aig_ManCoNum(p->pCla->pAig) - Aig_ManCiNum(p->pCla->pAig);
    // mark the nodes remaining in the classes
    Vec_PtrForEachEntry( Aig_Obj_t *, p->pCla->vClasses1, pObj, i )
    {
        pObj = Aig_ManCo( p->pCla->pAig, Offset+(long)pObj->pNext );
        pObj->fMarkA = 0;
    }
    Vec_PtrForEachEntry( Aig_Obj_t **, p->pCla->vClasses, ppClass, i )
    {
        for ( c = 0; ppClass[c]; c++ )
        {
            pObj = Aig_ManCo( p->pCla->pAig, Offset+(long)ppClass[c]->pNext );
            pObj->fMarkA = 0;
        }
    }
}